

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verbose.c
# Opt level: O3

void print_shifts(action *p)

{
  int iVar1;
  action *paVar2;
  action *q;
  
  if (p != (action *)0x0) {
    iVar1 = 0;
    paVar2 = p;
    do {
      if (paVar2->suppressed < '\x02') {
        iVar1 = iVar1 + (uint)(paVar2->action_code == '\x01');
      }
      paVar2 = paVar2->next;
    } while (paVar2 != (action *)0x0);
    if (0 < iVar1) {
      do {
        if ((p->action_code == '\x01') && (p->suppressed == '\0')) {
          fprintf((FILE *)verbose_file,"\t%s  shift %d\n",symbol_name[p->symbol],
                  (ulong)(uint)p->number);
        }
        p = p->next;
      } while (p != (action *)0x0);
    }
  }
  return;
}

Assistant:

void print_shifts(action *p)
{
    register int count;
    register action *q;

    count = 0;
    for (q = p; q; q = q->next)
    {
	if (q->suppressed < 2 && q->action_code == SHIFT)
	    ++count;
    }

    if (count > 0)
    {
	for (; p; p = p->next)
	{
	    if (p->action_code == SHIFT && p->suppressed == 0)
		fprintf(verbose_file, "\t%s  shift %d\n",
			    symbol_name[p->symbol], p->number);
	}
    }
}